

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::QueryPool>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  RefData<vk::Handle<(vk::HandleType)11>_> data;
  ulong __n;
  TestContext *pTVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  Unique<vk::Handle<(vk::HandleType)11>_> *this_01;
  reference this_02;
  allocator<char> local_2b9;
  string local_2b8;
  undefined1 local_291;
  Move<vk::Handle<(vk::HandleType)11>_> local_290;
  RefData<vk::Handle<(vk::HandleType)11>_> local_270;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_> local_250;
  uint local_23c;
  char *pcStack_238;
  deUint32 ndx;
  MessageBuilder local_230;
  undefined4 local_b0;
  deUint32 watchdogInterval;
  allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_> local_99;
  undefined1 local_98 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  objects;
  undefined1 local_78 [7];
  Resources res;
  Environment env;
  deUint32 numObjects;
  Context *context_local;
  Context *local_20;
  Parameters params_local;
  
  params_local.queryType = params.queryType;
  local_20 = context;
  unique0x10000535 = __return_storage_ptr__;
  env._52_4_ = QueryPool::getMaxConcurrent((Context *)this,(Parameters *)&local_20);
  Environment::Environment((Environment *)local_78,(Context *)this,env._52_4_);
  QueryPool::Resources::Resources
            ((Resources *)
             ((long)&objects.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),(Environment *)local_78
             ,(Parameters *)&local_20);
  __n = (ulong)(uint)env._52_4_;
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>::
  allocator(&local_99);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
            *)local_98,__n,&local_99);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>::
  ~allocator(&local_99);
  local_b0 = 0x400;
  pTVar1 = Context::getTestContext((Context *)this);
  this_00 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_230,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_230,(char (*) [10])"Creating ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&env.field_0x34);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x13b8ff9);
  pcStack_238 = ::vk::getTypeName<vk::Handle<(vk::HandleType)11>>();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xfffffffffffffdc8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])0x13837bb);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_230);
  for (local_23c = 0; local_23c < (uint)env._52_4_; local_23c = local_23c + 1) {
    this_01 = (Unique<vk::Handle<(vk::HandleType)11>_> *)operator_new(0x20);
    local_291 = 1;
    QueryPool::create(&local_290,(Environment *)local_78,
                      (Resources *)
                      ((long)&objects.
                              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                      (Parameters *)&local_20);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_270,(Move *)&local_290);
    data.deleter.m_deviceIface = local_270.deleter.m_deviceIface;
    data.object.m_internal = local_270.object.m_internal;
    data.deleter.m_device = local_270.deleter.m_device;
    data.deleter.m_allocator = local_270.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::Unique(this_01,data);
    local_291 = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>::SharedPtr
              (&local_250,this_01);
    this_02 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
                            *)local_98,(ulong)local_23c);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>::operator=
              (this_02,&local_250);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>::~SharedPtr(&local_250);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::~Move(&local_290);
    if ((local_23c != 0) && ((local_23c & 0x3ff) == 0)) {
      pTVar1 = Context::getTestContext((Context *)this);
      tcu::TestContext::touchWatchdog(pTVar1);
    }
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  ::clear((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
           *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"Ok",&local_2b9);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
             *)local_98);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}